

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.c
# Opt level: O1

void cstr_fill_bytes(char **cstring,char byte,size_t len)

{
  void *pvVar1;
  
  if (*(ulong *)(*cstring + -8) < len) {
    pvVar1 = alloc_realloc(*cstring + -0x10,len + 0x10);
    *(size_t *)((long)pvVar1 + 8) = len;
    *cstring = (char *)((long)pvVar1 + 0x10);
  }
  memset(*cstring,(uint)(byte)byte,len);
  *(size_t *)(*cstring + -0x10) = len;
  return;
}

Assistant:

static void
cstr_fill_bytes(char** cstring, char byte, size_t len)
{
  struct STRING_HEADER* header;

  /* resize the string with the given length */
  cstr_resize(cstring, len);
  /* initialize the memory of the cstring with byte */
  memset((void*)*cstring, (int)byte, len);
  /* dereference here since the memory address might have changed in cstr_resize */
  header = GET_HEADER(*cstring);
  /* set the length of the string to the newly allocated length */
  header->strlen = len;
}